

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_send_reliable_outgoing_commands(ENetHost *host,ENetPeer *peer)

{
  ulong uVar1;
  _ENetListNode *p_Var2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  void *data;
  sbyte sVar6;
  long in_RSI;
  long in_RDI;
  enet_uint32 windowSize;
  int canPing;
  int windowWrap;
  int windowExceeded;
  size_t commandSize;
  enet_uint16 reliableWindow;
  ENetChannel *channel;
  ENetListIterator currentCommand;
  ENetOutgoingCommand *outgoingCommand;
  ENetBuffer *buffer;
  ENetProtocol *command;
  uint local_74;
  long local_60;
  int local_54;
  ENetListIterator local_30;
  long *local_20;
  void *local_18;
  
  local_18 = (void *)(in_RDI + 0x6c + *(long *)(in_RDI + 0x6b0) * 0x32);
  local_20 = (long *)(in_RDI + 0x6b8 + *(long *)(in_RDI + 0xac8) * 0x10);
  bVar5 = false;
  bVar4 = false;
  local_54 = 1;
  local_30 = *(ENetListIterator *)(in_RSI + 0x110);
LAB_001098da:
  do {
    if (local_30 == (ENetListIterator)(in_RSI + 0x110)) {
LAB_00109de2:
      *(long *)(in_RDI + 0x6b0) = ((long)local_18 - (in_RDI + 0x6c)) / 0x32;
      *(long *)(in_RDI + 0xac8) = (long)local_20 - (in_RDI + 0x6b8) >> 4;
      return local_54;
    }
    if ((ulong)*(byte *)((long)&local_30[2].previous + 1) < *(ulong *)(in_RSI + 0x48)) {
      local_60 = *(long *)(in_RSI + 0x40) + (ulong)*(byte *)((long)&local_30[2].previous + 1) * 0x50
      ;
    }
    else {
      local_60 = 0;
    }
    uVar3 = *(ushort *)&local_30[1].next / 0x1000;
    sVar6 = (sbyte)uVar3;
    if (local_60 == 0) {
LAB_00109a27:
      if (local_30[6].next != (_ENetListNode *)0x0) {
        if (!bVar5) {
          local_74 = (uint)(*(int *)(in_RSI + 0x8c) * *(int *)(in_RSI + 0xd4)) >> 5;
          if (local_74 <= *(uint *)(in_RSI + 0xd0)) {
            local_74 = *(uint *)(in_RSI + 0xd0);
          }
          if (local_74 < *(int *)(in_RSI + 0xd8) + (uint)*(ushort *)((long)&local_30[2].next + 4)) {
            bVar5 = true;
          }
        }
        if (bVar5) {
          local_30 = local_30->next;
          goto LAB_001098da;
        }
      }
      local_54 = 0;
      uVar1 = commandSizes[(int)(*(byte *)&local_30[2].previous & 0xf)];
      if ((((void *)(in_RDI + 0x6acU) <= local_18) || ((long *)(in_RDI + 0xac8U) <= local_20 + 2))
         || (((ulong)*(uint *)(in_RSI + 0xd0) - *(long *)(in_RDI + 0x60) < uVar1 ||
             ((local_30[6].next != (_ENetListNode *)0x0 &&
              ((ushort)((short)*(undefined4 *)(in_RSI + 0xd0) -
                       (short)*(undefined8 *)(in_RDI + 0x60)) <
               (ushort)((short)uVar1 + *(short *)((long)&local_30[2].next + 4)))))))) {
        *(undefined4 *)(in_RDI + 0x58) = 1;
        goto LAB_00109de2;
      }
      p_Var2 = local_30->next;
      if ((local_60 != 0) && (*(short *)((long)&local_30[2].next + 6) == 0)) {
        *(ushort *)(local_60 + 4) = *(ushort *)(local_60 + 4) | (ushort)(1 << sVar6);
        *(short *)(local_60 + 6 + (ulong)uVar3 * 2) =
             *(short *)(local_60 + 6 + (ulong)uVar3 * 2) + 1;
      }
      *(short *)((long)&local_30[2].next + 6) = *(short *)((long)&local_30[2].next + 6) + 1;
      if (*(int *)&local_30[1].previous == 0) {
        *(int *)&local_30[1].previous = *(int *)(in_RSI + 200) + *(int *)(in_RSI + 0xcc) * 4;
        *(int *)((long)&local_30[1].previous + 4) =
             *(int *)(in_RSI + 0xac) * *(int *)&local_30[1].previous;
      }
      if (*(long *)(in_RSI + 0xf0) == in_RSI + 0xf0) {
        *(int *)(in_RSI + 0x70) = *(int *)(in_RDI + 0x40) + *(int *)&local_30[1].previous;
      }
      data = enet_list_remove(local_30);
      enet_list_insert((ENetListIterator)(in_RSI + 0xf0),data);
      *(undefined4 *)((long)&local_30[1].next + 4) = *(undefined4 *)(in_RDI + 0x40);
      *local_20 = (long)local_18;
      local_20[1] = uVar1;
      *(long *)(in_RDI + 0x60) = local_20[1] + *(long *)(in_RDI + 0x60);
      *(uint *)(in_RDI + 0x68) = *(uint *)(in_RDI + 0x68) | 0x8000000;
      memcpy(local_18,&local_30[2].previous,0x32);
      if (local_30[6].next != (_ENetListNode *)0x0) {
        local_20[2] = (long)&(local_30[6].next[1].next)->next + (ulong)*(uint *)&local_30[2].next;
        local_20[3] = (ulong)*(ushort *)((long)&local_30[2].next + 4);
        *(ulong *)(in_RDI + 0x60) =
             (ulong)*(ushort *)((long)&local_30[2].next + 4) + *(long *)(in_RDI + 0x60);
        *(uint *)(in_RSI + 0xd8) =
             (uint)*(ushort *)((long)&local_30[2].next + 4) + *(int *)(in_RSI + 0xd8);
        local_20 = local_20 + 2;
      }
      *(int *)(in_RSI + 0x7c) = *(int *)(in_RSI + 0x7c) + 1;
      local_18 = (void *)((long)local_18 + 0x32);
      local_20 = local_20 + 2;
      local_30 = p_Var2;
      goto LAB_001098da;
    }
    if ((((!bVar4) && (*(short *)((long)&local_30[2].next + 6) == 0)) &&
        ((uint)*(ushort *)&local_30[1].next % 0x1000 == 0)) &&
       ((0xfff < *(ushort *)(local_60 + 6 + (long)(int)((uVar3 + 0xf) % 0x10) * 2) ||
        (((uint)*(ushort *)(local_60 + 4) & (0xff << sVar6 | 0xff >> (0x10U - sVar6 & 0x1f))) != 0))
       )) {
      bVar4 = true;
    }
    if (!bVar4) goto LAB_00109a27;
    local_30 = local_30->next;
  } while( true );
}

Assistant:

static int
enet_protocol_send_reliable_outgoing_commands (ENetHost * host, ENetPeer * peer)
{
    ENetProtocol * command = & host -> commands [host -> commandCount];
    ENetBuffer * buffer = & host -> buffers [host -> bufferCount];
    ENetOutgoingCommand * outgoingCommand;
    ENetListIterator currentCommand;
    ENetChannel *channel;
    enet_uint16 reliableWindow;
    size_t commandSize;
    int windowExceeded = 0, windowWrap = 0, canPing = 1;

    currentCommand = enet_list_begin (& peer -> outgoingReliableCommands);
    
    while (currentCommand != enet_list_end (& peer -> outgoingReliableCommands))
    {
       outgoingCommand = (ENetOutgoingCommand *) currentCommand;

       channel = outgoingCommand -> command.header.channelID < peer -> channelCount ? & peer -> channels [outgoingCommand -> command.header.channelID] : NULL;
       reliableWindow = outgoingCommand -> reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
       if (channel != NULL)
       {
           if (! windowWrap &&      
               outgoingCommand -> sendAttempts < 1 && 
               ! (outgoingCommand -> reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) &&
               (channel -> reliableWindows [(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE ||
                 channel -> usedReliableWindows & ((((1 << ENET_PEER_FREE_RELIABLE_WINDOWS) - 1) << reliableWindow) | 
                   (((1 << ENET_PEER_FREE_RELIABLE_WINDOWS) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow)))))
             windowWrap = 1;
          if (windowWrap)
          {
             currentCommand = enet_list_next (currentCommand);
 
             continue;
          }
       }
 
       if (outgoingCommand -> packet != NULL)
       {
          if (! windowExceeded)
          {
             enet_uint32 windowSize = (peer -> packetThrottle * peer -> windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;
             
             if (peer -> reliableDataInTransit + outgoingCommand -> fragmentLength > ENET_MAX (windowSize, peer -> mtu))
               windowExceeded = 1;
          }
          if (windowExceeded)
          {
             currentCommand = enet_list_next (currentCommand);

             continue;
          }
       }

       canPing = 0;

       commandSize = commandSizes [outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK];
       if (command >= & host -> commands [sizeof (host -> commands) / sizeof (ENetProtocol)] ||
           buffer + 1 >= & host -> buffers [sizeof (host -> buffers) / sizeof (ENetBuffer)] ||
           peer -> mtu - host -> packetSize < commandSize ||
           (outgoingCommand -> packet != NULL && 
             (enet_uint16) (peer -> mtu - host -> packetSize) < (enet_uint16) (commandSize + outgoingCommand -> fragmentLength)))
       {
          host -> continueSending = 1;
          
          break;
       }

       currentCommand = enet_list_next (currentCommand);

       if (channel != NULL && outgoingCommand -> sendAttempts < 1)
       {
          channel -> usedReliableWindows |= 1 << reliableWindow;
          ++ channel -> reliableWindows [reliableWindow];
       }

       ++ outgoingCommand -> sendAttempts;
 
       if (outgoingCommand -> roundTripTimeout == 0)
       {
          outgoingCommand -> roundTripTimeout = peer -> roundTripTime + 4 * peer -> roundTripTimeVariance;
          outgoingCommand -> roundTripTimeoutLimit = peer -> timeoutLimit * outgoingCommand -> roundTripTimeout;
       }

       if (enet_list_empty (& peer -> sentReliableCommands))
         peer -> nextTimeout = host -> serviceTime + outgoingCommand -> roundTripTimeout;

       enet_list_insert (enet_list_end (& peer -> sentReliableCommands),
                         enet_list_remove (& outgoingCommand -> outgoingCommandList));

       outgoingCommand -> sentTime = host -> serviceTime;

       buffer -> data = command;
       buffer -> dataLength = commandSize;

       host -> packetSize += buffer -> dataLength;
       host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;

       * command = outgoingCommand -> command;

       if (outgoingCommand -> packet != NULL)
       {
          ++ buffer;
          
          buffer -> data = outgoingCommand -> packet -> data + outgoingCommand -> fragmentOffset;
          buffer -> dataLength = outgoingCommand -> fragmentLength;

          host -> packetSize += outgoingCommand -> fragmentLength;

          peer -> reliableDataInTransit += outgoingCommand -> fragmentLength;
       }

       ++ peer -> packetsSent;
        
       ++ command;
       ++ buffer;
    }

    host -> commandCount = command - host -> commands;
    host -> bufferCount = buffer - host -> buffers;

    return canPing;
}